

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::StmtBlock::clear(StmtBlock *this)

{
  pointer psVar1;
  shared_ptr<kratos::Stmt> *stmt;
  pointer psVar2;
  
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    (*(((psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode
      )._vptr_IRNode[0xc])();
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::clear
            (&this->stmts_);
  return;
}

Assistant:

void StmtBlock::clear() {
    for (auto &stmt : stmts_) {
        stmt->clear();
    }
    stmts_.clear();
}